

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O0

void __thiscall duckdb::Vector::Initialize(Vector *this,bool initialize_to_zero,idx_t capacity)

{
  PhysicalType PVar1;
  LogicalType *this_00;
  idx_t iVar2;
  data_ptr_t pdVar3;
  ulong in_RDX;
  byte in_SIL;
  Vector *in_RDI;
  idx_t type_size;
  templated_unique_single_t array_buffer;
  templated_unique_single_t list_buffer;
  templated_unique_single_t struct_buffer;
  PhysicalType internal_type;
  LogicalType *type;
  idx_t in_stack_ffffffffffffff38;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffff40;
  VectorArrayBuffer *in_stack_ffffffffffffff48;
  shared_ptr<duckdb::VectorBuffer,_true> *in_stack_ffffffffffffff50;
  LogicalType *in_stack_ffffffffffffff68;
  PhysicalType in_stack_ffffffffffffff8f;
  optional_ptr<duckdb::Allocator,_true> in_stack_ffffffffffffffa8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffffb0;
  
  shared_ptr<duckdb::VectorBuffer,_true>::reset((shared_ptr<duckdb::VectorBuffer,_true> *)0x3db849);
  TemplatedValidityMask<unsigned_long>::Reset(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  this_00 = GetType(in_RDI);
  PVar1 = LogicalType::InternalType(this_00);
  if (PVar1 == STRUCT) {
    make_uniq<duckdb::VectorStructBuffer,duckdb::LogicalType_const&,unsigned_long&>
              (in_stack_ffffffffffffff68,(unsigned_long *)in_RDI);
    ::std::unique_ptr<duckdb::VectorStructBuffer,_std::default_delete<duckdb::VectorStructBuffer>_>
    ::release((unique_ptr<duckdb::VectorStructBuffer,_std::default_delete<duckdb::VectorStructBuffer>_>
               *)0x3db8bc);
    shared_ptr<duckdb::VectorBuffer,_true>::shared_ptr<duckdb::VectorStructBuffer,_0>
              (in_stack_ffffffffffffff50,(VectorStructBuffer *)in_stack_ffffffffffffff48);
    shared_ptr<duckdb::VectorBuffer,_true>::operator=
              (in_stack_ffffffffffffff50,
               (shared_ptr<duckdb::VectorBuffer,_true> *)in_stack_ffffffffffffff48);
    shared_ptr<duckdb::VectorBuffer,_true>::~shared_ptr
              ((shared_ptr<duckdb::VectorBuffer,_true> *)0x3db8f1);
    unique_ptr<duckdb::VectorStructBuffer,_std::default_delete<duckdb::VectorStructBuffer>,_true>::
    ~unique_ptr((unique_ptr<duckdb::VectorStructBuffer,_std::default_delete<duckdb::VectorStructBuffer>,_true>
                 *)0x3db8fe);
  }
  else if (PVar1 == LIST) {
    in_stack_ffffffffffffff50 = (shared_ptr<duckdb::VectorBuffer,_true> *)&stack0xffffffffffffffa8;
    make_uniq<duckdb::VectorListBuffer,duckdb::LogicalType_const&,unsigned_long&>
              (in_stack_ffffffffffffff68,(unsigned_long *)in_RDI);
    ::std::unique_ptr<duckdb::VectorListBuffer,_std::default_delete<duckdb::VectorListBuffer>_>::
    release((unique_ptr<duckdb::VectorListBuffer,_std::default_delete<duckdb::VectorListBuffer>_> *)
            0x3db95d);
    shared_ptr<duckdb::VectorBuffer,_true>::shared_ptr<duckdb::VectorListBuffer,_0>
              (in_stack_ffffffffffffff50,(VectorListBuffer *)in_stack_ffffffffffffff48);
    shared_ptr<duckdb::VectorBuffer,_true>::operator=
              (in_stack_ffffffffffffff50,
               (shared_ptr<duckdb::VectorBuffer,_true> *)in_stack_ffffffffffffff48);
    shared_ptr<duckdb::VectorBuffer,_true>::~shared_ptr
              ((shared_ptr<duckdb::VectorBuffer,_true> *)0x3db989);
    unique_ptr<duckdb::VectorListBuffer,_std::default_delete<duckdb::VectorListBuffer>,_true>::
    ~unique_ptr((unique_ptr<duckdb::VectorListBuffer,_std::default_delete<duckdb::VectorListBuffer>,_true>
                 *)0x3db993);
  }
  else if (PVar1 == ARRAY) {
    in_stack_ffffffffffffff48 = (VectorArrayBuffer *)&stack0xffffffffffffff90;
    make_uniq<duckdb::VectorArrayBuffer,duckdb::LogicalType_const&,unsigned_long&>
              (in_stack_ffffffffffffff68,(unsigned_long *)in_RDI);
    ::std::unique_ptr<duckdb::VectorArrayBuffer,_std::default_delete<duckdb::VectorArrayBuffer>_>::
    release((unique_ptr<duckdb::VectorArrayBuffer,_std::default_delete<duckdb::VectorArrayBuffer>_>
             *)0x3db9ef);
    shared_ptr<duckdb::VectorBuffer,_true>::shared_ptr<duckdb::VectorArrayBuffer,_0>
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    shared_ptr<duckdb::VectorBuffer,_true>::operator=
              (in_stack_ffffffffffffff50,
               (shared_ptr<duckdb::VectorBuffer,_true> *)in_stack_ffffffffffffff48);
    shared_ptr<duckdb::VectorBuffer,_true>::~shared_ptr
              ((shared_ptr<duckdb::VectorBuffer,_true> *)0x3dba1b);
    unique_ptr<duckdb::VectorArrayBuffer,_std::default_delete<duckdb::VectorArrayBuffer>,_true>::
    ~unique_ptr((unique_ptr<duckdb::VectorArrayBuffer,_std::default_delete<duckdb::VectorArrayBuffer>,_true>
                 *)0x3dba25);
  }
  iVar2 = GetTypeIdSize(in_stack_ffffffffffffff8f);
  if (iVar2 != 0) {
    VectorBuffer::CreateStandardVector
              ((LogicalType *)in_stack_ffffffffffffff48,(idx_t)in_stack_ffffffffffffff40);
    shared_ptr<duckdb::VectorBuffer,_true>::operator=
              (in_stack_ffffffffffffff50,
               (shared_ptr<duckdb::VectorBuffer,_true> *)in_stack_ffffffffffffff48);
    shared_ptr<duckdb::VectorBuffer,_true>::~shared_ptr
              ((shared_ptr<duckdb::VectorBuffer,_true> *)0x3dbaa0);
    shared_ptr<duckdb::VectorBuffer,_true>::operator->
              ((shared_ptr<duckdb::VectorBuffer,_true> *)in_stack_ffffffffffffff40);
    pdVar3 = VectorBuffer::GetData((VectorBuffer *)0x3dbab6);
    in_RDI->data = pdVar3;
    if ((in_SIL & 1) != 0) {
      memset(in_RDI->data,0,in_RDX * iVar2);
    }
  }
  iVar2 = ValidityMask::Capacity(&in_RDI->validity);
  if (iVar2 < in_RDX) {
    ValidityMask::Resize
              ((ValidityMask *)in_stack_ffffffffffffffb0._M_pi,(idx_t)in_stack_ffffffffffffffa8.ptr)
    ;
  }
  return;
}

Assistant:

void Vector::Initialize(bool initialize_to_zero, idx_t capacity) {
	auxiliary.reset();
	validity.Reset();
	auto &type = GetType();
	auto internal_type = type.InternalType();
	if (internal_type == PhysicalType::STRUCT) {
		auto struct_buffer = make_uniq<VectorStructBuffer>(type, capacity);
		auxiliary = shared_ptr<VectorBuffer>(struct_buffer.release());
	} else if (internal_type == PhysicalType::LIST) {
		auto list_buffer = make_uniq<VectorListBuffer>(type, capacity);
		auxiliary = shared_ptr<VectorBuffer>(list_buffer.release());
	} else if (internal_type == PhysicalType::ARRAY) {
		auto array_buffer = make_uniq<VectorArrayBuffer>(type, capacity);
		auxiliary = shared_ptr<VectorBuffer>(array_buffer.release());
	}
	auto type_size = GetTypeIdSize(internal_type);
	if (type_size > 0) {
		buffer = VectorBuffer::CreateStandardVector(type, capacity);
		data = buffer->GetData();
		if (initialize_to_zero) {
			memset(data, 0, capacity * type_size);
		}
	}

	if (capacity > validity.Capacity()) {
		validity.Resize(capacity);
	}
}